

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O1

void nn_ctcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_queue_item *self_00;
  int iVar1;
  
  if (type == -3 && src == -2) {
    self_00 = &self[10].stopped.item;
    iVar1 = nn_stcp_isidle((nn_stcp *)self_00);
    if (iVar1 == 0) {
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x67,1);
      nn_stcp_stop((nn_stcp *)self_00);
    }
    *(undefined4 *)&self[1].fn = 10;
  }
  if (*(int *)&self[1].fn == 10) {
    iVar1 = nn_stcp_isidle((nn_stcp *)&self[10].stopped.item);
    if (iVar1 == 0) {
      return;
    }
    nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
    nn_usock_stop((nn_usock *)&self[1].state);
    nn_dns_stop((nn_dns *)&self[0x16].owner);
    *(undefined4 *)&self[1].fn = 0xb;
  }
  if (*(int *)&self[1].fn != 0xb) {
    nn_ctcp_shutdown_cold_1();
  }
  nn_ctcp_shutdown_cold_2();
  return;
}

Assistant:

static void nn_ctcp_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ctcp *ctcp;

    ctcp = nn_cont (self, struct nn_ctcp, fsm);

    if (src == NN_FSM_ACTION && type == NN_FSM_STOP) {
        if (!nn_stcp_isidle (&ctcp->stcp)) {
            nn_ep_stat_increment (ctcp->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_stcp_stop (&ctcp->stcp);
        }
        ctcp->state = NN_CTCP_STATE_STOPPING_STCP_FINAL;
    }
    if (ctcp->state == NN_CTCP_STATE_STOPPING_STCP_FINAL) {
        if (!nn_stcp_isidle (&ctcp->stcp))
            return;
        nn_backoff_stop (&ctcp->retry);
        nn_usock_stop (&ctcp->usock);
        nn_dns_stop (&ctcp->dns);
        ctcp->state = NN_CTCP_STATE_STOPPING;
    }
    if (nn_slow (ctcp->state == NN_CTCP_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&ctcp->retry) ||
              !nn_usock_isidle (&ctcp->usock) ||
              !nn_dns_isidle (&ctcp->dns))
            return;
        ctcp->state = NN_CTCP_STATE_IDLE;
        nn_fsm_stopped_noevent (&ctcp->fsm);
        nn_ep_stopped (ctcp->ep);
        return;
    }

    nn_fsm_bad_state (ctcp->state, src, type);
}